

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool haltOnSubcommand)

{
  pointer *pppOVar1;
  Option *pOVar2;
  pointer pcVar3;
  iterator __position;
  pointer psVar4;
  element_type *peVar5;
  _Head_base<0UL,_CLI::Option_*,_false> _Var6;
  size_type sVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  char cVar9;
  type_conflict tVar10;
  App *pAVar11;
  pointer psVar12;
  ExtrasError *this_00;
  int iVar13;
  ulong uVar14;
  undefined7 in_register_00000011;
  undefined1 uVar15;
  iterator __begin3;
  pointer puVar16;
  App *pAVar17;
  uint uVar18;
  long lVar19;
  Option_p *opt;
  pointer puVar20;
  pointer pbVar21;
  bool bVar22;
  Option *posOpt;
  string pos;
  _Head_base<0UL,_CLI::Option_*,_false> local_f0;
  pointer local_e8;
  string local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  undefined4 local_b4;
  pointer local_b0;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  local_b4 = (undefined4)CONCAT71(in_register_00000011,haltOnSubcommand);
  local_e8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_f0._M_head_impl = (Option *)0x0;
  local_c0 = args;
  if (this->positionals_at_end_ == true) {
    uVar14 = 0;
    puVar16 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (puVar20 = puVar16;
        puVar20 !=
        (this->options_).
        super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; puVar20 = puVar20 + 1) {
      pOVar2 = (puVar20->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (((((pOVar2->pname_)._M_string_length != 0) &&
           ((pOVar2->super_OptionBase<CLI::Option>).required_ == true)) &&
          (uVar18 = pOVar2->expected_min_ * pOVar2->type_size_min_, 0 < (int)uVar18)) &&
         (lVar19 = (long)*(pointer *)
                          ((long)&(pOVar2->results_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          + 8) -
                   *(long *)&(pOVar2->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl >> 5, (int)lVar19 < (int)uVar18)) {
        uVar14 = (uVar14 + uVar18) - lVar19;
      }
    }
    if ((ulong)((long)local_e8 -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
      puVar20 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (; puVar16 != puVar20; puVar16 = puVar16 + 1) {
        pOVar2 = (puVar16->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        cVar9 = '\0';
        if ((((pOVar2->pname_)._M_string_length != 0) &&
            ((pOVar2->super_OptionBase<CLI::Option>).required_ == true)) &&
           ((int)((ulong)((long)*(pointer *)
                                 ((long)&(pOVar2->results_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 + 8) -
                         *(long *)&(pOVar2->results_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl) >> 5) < pOVar2->expected_min_ * pOVar2->type_size_min_)
           ) {
          if (this->validate_positionals_ == true) {
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            pcVar3 = local_e8[-1]._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e0,pcVar3,pcVar3 + local_e8[-1]._M_string_length);
            Option::_validate(&local_a8,
                              (puVar16->_M_t).
                              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                              .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_e0,0)
            ;
            ::std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            sVar7 = local_e0._M_string_length;
            bVar22 = local_e0._M_string_length != 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            if (sVar7 != 0) {
              cVar9 = bVar22 * '\x03';
              goto LAB_00122e4b;
            }
          }
          local_f0._M_head_impl =
               (puVar16->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          cVar9 = '\x02';
        }
LAB_00122e4b:
        if ((cVar9 != '\x03') && (cVar9 != '\0')) break;
      }
    }
  }
  if (local_f0._M_head_impl == (Option *)0x0) {
    puVar16 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar20 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar16 != puVar20) {
      local_b0 = puVar20;
      do {
        pOVar2 = (puVar16->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        cVar9 = '\0';
        if ((pOVar2->pname_)._M_string_length != 0) {
          pbVar21 = *(pointer *)
                     ((long)&(pOVar2->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 8);
          lVar19 = *(long *)&(pOVar2->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl;
          local_e0._M_dataplus._M_p._0_4_ = pOVar2->type_size_max_;
          tVar10 = detail::checked_multiply<int>((int *)&local_e0,pOVar2->expected_max_);
          iVar13 = 0x20000000;
          if (tVar10) {
            iVar13 = (int)local_e0._M_dataplus._M_p;
          }
          if (((int)((ulong)((long)pbVar21 - lVar19) >> 5) < iVar13) ||
             (cVar9 = '\0',
             ((puVar16->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
              _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true))
          {
            if (this->validate_positionals_ == true) {
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              pcVar3 = local_e8[-1]._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,pcVar3,pcVar3 + local_e8[-1]._M_string_length);
              Option::_validate(&local_a8,
                                (puVar16->_M_t).
                                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                                .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_e0,
                                0);
              ::std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              sVar7 = local_e0._M_string_length;
              bVar22 = local_e0._M_string_length != 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p);
              }
              if (sVar7 != 0) {
                cVar9 = bVar22 * '\x05';
                puVar20 = local_b0;
                goto LAB_00122fd3;
              }
            }
            local_f0._M_head_impl =
                 (puVar16->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
            cVar9 = '\x04';
            puVar20 = local_b0;
          }
        }
LAB_00122fd3:
      } while (((cVar9 == '\x05') || (cVar9 == '\0')) && (puVar16 = puVar16 + 1, puVar16 != puVar20)
              );
    }
  }
  pvVar8 = local_c0;
  if (local_f0._M_head_impl != (Option *)0x0) {
    __position._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::
      _M_realloc_insert<CLI::Option*const&>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,__position
                 ,&local_f0._M_head_impl);
    }
    else {
      *__position._M_current = local_f0._M_head_impl;
      pppOVar1 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    _Var6._M_head_impl = local_f0._M_head_impl;
    if ((((local_f0._M_head_impl)->inject_separator_ == true) &&
        (pbVar21 = ((local_f0._M_head_impl)->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        ((local_f0._M_head_impl)->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar21)) &&
       (pbVar21[-1]._M_string_length != 0)) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      Option::_add_result(local_f0._M_head_impl,&local_50,&(local_f0._M_head_impl)->results_);
      (_Var6._M_head_impl)->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    _Var6._M_head_impl = local_f0._M_head_impl;
    if (((local_f0._M_head_impl)->trigger_on_result_ == true) &&
       ((local_f0._M_head_impl)->current_option_state_ == callback_run)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(local_f0._M_head_impl)->results_);
      (_Var6._M_head_impl)->current_option_state_ = parsing;
    }
    _Var6._M_head_impl = local_f0._M_head_impl;
    pcVar3 = local_e8[-1]._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + local_e8[-1]._M_string_length);
    Option::_add_result(_Var6._M_head_impl,&local_70,&(_Var6._M_head_impl)->results_);
    (_Var6._M_head_impl)->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pvVar8 = local_c0;
    if ((local_f0._M_head_impl)->trigger_on_result_ == true) {
      Option::run_callback(local_f0._M_head_impl);
    }
    pbVar21 = (pvVar8->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (pvVar8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar21 + -1;
    pcVar3 = pbVar21[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar21[-1].field_2) {
      operator_delete(pcVar3);
      return true;
    }
    return true;
  }
  psVar4 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_f0._M_head_impl = (Option *)0x0;
  for (psVar12 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar4; psVar12 = psVar12 + 1
      ) {
    pAVar11 = (psVar12->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((pAVar11->name_)._M_string_length == 0) && (pAVar11->disabled_ == false)) &&
       (bVar22 = _parse_positional(pAVar11,pvVar8,false), bVar22)) {
      pAVar11 = (psVar12->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (pAVar11->pre_parse_called_ == false) {
        _trigger_pre_parse(pAVar11,(long)(pvVar8->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar8->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start >> 5);
        return true;
      }
      return true;
    }
  }
  if ((this->parent_ != (App *)0x0) && (pAVar11 = this->parent_, this->fallthrough_ == true)) {
    do {
      pAVar17 = pAVar11;
      if (pAVar17->parent_ == (App *)0x0) break;
      pAVar11 = pAVar17->parent_;
    } while ((pAVar17->name_)._M_string_length == 0);
    bVar22 = _parse_positional(pAVar17,pvVar8,
                               (this->parse_complete_callback_).super__Function_base._M_manager !=
                               (_Manager_type)0x0);
    return bVar22;
  }
  pAVar11 = _find_subcommand(this,(pvVar8->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
  if ((pAVar11 != (App *)0x0) &&
     ((this->require_subcommand_max_ == 0 ||
      ((ulong)((long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) < this->require_subcommand_max_)))) {
    if ((char)local_b4 != '\0') {
      return false;
    }
    pbVar21 = (pvVar8->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (pvVar8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar21 + -1;
    pcVar3 = pbVar21[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar21[-1].field_2) {
      operator_delete(pcVar3);
    }
    _parse(pAVar11,pvVar8);
    return true;
  }
  if (this->subcommand_fallthrough_ != true) goto LAB_001232d2;
  pAVar11 = this->parent_;
  pAVar17 = this;
  if (this->parent_ != (App *)0x0) {
    do {
      pAVar17 = pAVar11;
      if (pAVar17->parent_ == (App *)0x0) break;
      pAVar11 = pAVar17->parent_;
    } while ((pAVar17->name_)._M_string_length == 0);
  }
  pAVar11 = _find_subcommand(pAVar17,(pvVar8->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
  if (pAVar11 == (App *)0x0) {
LAB_001232ca:
    uVar15 = 1;
  }
  else {
    pAVar11 = pAVar11->parent_;
    if ((pAVar11->require_subcommand_max_ != 0) &&
       (pAVar11->require_subcommand_max_ <=
        (ulong)((long)(pAVar11->parsed_subcommands_).
                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pAVar11->parsed_subcommands_).
                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3))) goto LAB_001232ca;
    uVar15 = 0;
  }
  if (!(bool)uVar15) {
    return false;
  }
LAB_001232d2:
  if (this->positionals_at_end_ == true) {
    this_00 = (ExtrasError *)__cxa_allocate_exception(0x38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_88,pvVar8);
    ExtrasError::ExtrasError(this_00,&this->name_,&local_88);
    __cxa_throw(this_00,&ExtrasError::typeinfo,Error::~Error);
  }
  if ((this->parent_ != (App *)0x0) && ((this->name_)._M_string_length == 0)) {
    return false;
  }
  local_e8 = local_e8 + -1;
  local_e0._M_dataplus._M_p = local_e0._M_dataplus._M_p & 0xffffffffffffff00;
  if (this->allow_extras_ == false) {
    psVar12 = (this->subcommands_).
              super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar12 != psVar4) {
      bVar22 = false;
      do {
        peVar5 = (psVar12->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (((peVar5->name_)._M_string_length == 0) && (peVar5->allow_extras_ == true)) {
          ::std::
          vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
          ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                    ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                      *)&peVar5->missing_,(Classifier *)&local_e0,local_e8);
          if (!bVar22) goto LAB_00123365;
          break;
        }
        psVar12 = psVar12 + 1;
        bVar22 = psVar12 == psVar4;
      } while (!bVar22);
    }
  }
  ::std::
  vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
  ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
            ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
              *)&this->missing_,(Classifier *)&local_e0,local_e8);
LAB_00123365:
  pbVar21 = (pvVar8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (pvVar8->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pbVar21 + -1;
  pcVar3 = pbVar21[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &pbVar21[-1].field_2) {
    operator_delete(pcVar3);
  }
  if (this->prefix_command_ != true) {
    return true;
  }
  pbVar21 = (pvVar8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((pvVar8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start == pbVar21) {
    return true;
  }
  do {
    local_e0._M_dataplus._M_p = local_e0._M_dataplus._M_p & 0xffffffffffffff00;
    if (this->allow_extras_ == false) {
      psVar12 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = (this->subcommands_).
               super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar12 != psVar4) {
        bVar22 = false;
        do {
          peVar5 = (psVar12->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (((peVar5->name_)._M_string_length == 0) && (peVar5->allow_extras_ == true)) {
            ::std::
            vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
            ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                      ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                        *)&peVar5->missing_,(Classifier *)&local_e0,pbVar21 + -1);
            if (!bVar22) goto LAB_001233fb;
            break;
          }
          psVar12 = psVar12 + 1;
          bVar22 = psVar12 == psVar4;
        } while (!bVar22);
      }
    }
    ::std::
    vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
    ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
              ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                *)&this->missing_,(Classifier *)&local_e0,pbVar21 + -1);
LAB_001233fb:
    pbVar21 = (local_c0->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (local_c0->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar21 + -1;
    pcVar3 = pbVar21[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar21[-1].field_2) {
      operator_delete(pcVar3);
    }
    pbVar21 = (local_c0->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((local_c0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start == pbVar21) {
      return true;
    }
  } while( true );
}

Assistant:

CLI11_INLINE bool App::_parse_positional(std::vector<std::string> &args, bool haltOnSubcommand) {

    const std::string &positional = args.back();
    Option *posOpt{nullptr};

    if(positionals_at_end_) {
        // deal with the case of required arguments at the end which should take precedence over other arguments
        auto arg_rem = args.size();
        auto remreq = _count_remaining_positionals(true);
        if(arg_rem <= remreq) {
            for(const Option_p &opt : options_) {
                if(opt->get_positional() && opt->required_) {
                    if(static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                        if(validate_positionals_) {
                            std::string pos = positional;
                            pos = opt->_validate(pos, 0);
                            if(!pos.empty()) {
                                continue;
                            }
                        }
                        posOpt = opt.get();
                        break;
                    }
                }
            }
        }
    }
    if(posOpt == nullptr) {
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected_max() || opt->get_allow_extra_args())) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos, 0);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                posOpt = opt.get();
                break;
            }
        }
    }
    if(posOpt != nullptr) {
        parse_order_.push_back(posOpt);
        if(posOpt->get_inject_separator()) {
            if(!posOpt->results().empty() && !posOpt->results().back().empty()) {
                posOpt->add_result(std::string{});
            }
        }
        if(posOpt->get_trigger_on_parse() && posOpt->current_option_state_ == Option::option_state::callback_run) {
            posOpt->clear();
        }
        posOpt->add_result(positional);
        if(posOpt->get_trigger_on_parse()) {
            posOpt->run_callback();
        }

        args.pop_back();
        return true;
    }

    for(auto &subc : subcommands_) {
        if((subc->name_.empty()) && (!subc->disabled_)) {
            if(subc->_parse_positional(args, false)) {
                if(!subc->pre_parse_called_) {
                    subc->_trigger_pre_parse(args.size());
                }
                return true;
            }
        }
    }
    // let the parent deal with it if possible
    if(parent_ != nullptr && fallthrough_) {
        return _get_fallthrough_parent()->_parse_positional(args, static_cast<bool>(parse_complete_callback_));
    }
    /// Try to find a local subcommand that is repeated
    auto *com = _find_subcommand(args.back(), true, false);
    if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
        if(haltOnSubcommand) {
            return false;
        }
        args.pop_back();
        com->_parse(args);
        return true;
    }
    if(subcommand_fallthrough_) {
        /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
        /// subcommand in a broader way, if one exists let the parent deal with it
        auto *parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        com = parent_app->_find_subcommand(args.back(), true, false);
        if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                              com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
            return false;
        }
    }
    if(positionals_at_end_) {
        throw CLI::ExtrasError(name_, args);
    }
    /// If this is an option group don't deal with it
    if(parent_ != nullptr && name_.empty()) {
        return false;
    }
    /// We are out of other options this goes to missing
    _move_to_missing(detail::Classifier::NONE, positional);
    args.pop_back();
    if(prefix_command_) {
        while(!args.empty()) {
            _move_to_missing(detail::Classifier::NONE, args.back());
            args.pop_back();
        }
    }

    return true;
}